

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Var * __thiscall wabt::Var::operator=(Var *this,Var *rhs)

{
  Index IVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  
  pcVar3 = (rhs->loc).filename.data_;
  sVar4 = (rhs->loc).filename.size_;
  uVar5 = *(undefined8 *)((long)&(rhs->loc).field_1 + 8);
  (this->loc).field_1.field_1.offset = (rhs->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar5;
  (this->loc).filename.data_ = pcVar3;
  (this->loc).filename.size_ = sVar4;
  if (rhs->type_ == Index) {
    IVar1 = (rhs->field_2).index_;
    if ((this->type_ == Name) &&
       (pcVar2 = (this->field_2).name_._M_dataplus._M_p,
       pcVar2 != (pointer)((long)&this->field_2 + 0x10))) {
      operator_delete(pcVar2);
    }
    this->type_ = Index;
    (this->field_2).index_ = IVar1;
  }
  else {
    set_name(this,*(string_view *)&rhs->field_2);
  }
  return this;
}

Assistant:

Var& Var::operator=(Var&& rhs) {
  loc = rhs.loc;
  if (rhs.is_index()) {
    set_index(rhs.index_);
  } else {
    set_name(rhs.name_);
  }
  return *this;
}